

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O3

Patient * __thiscall
Hospital::Entered_Patient
          (Hospital *this,string *username,string *password,
          vector<Patient,_std::allocator<Patient>_> *All_Of_Patients)

{
  _Alloc_hider _Var1;
  int iVar2;
  ulong uVar3;
  pointer pPVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  string local_70;
  string local_50;
  
  pPVar4 = (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
      super__Vector_impl_data._M_finish != pPVar4) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      Human::User_name_Getter_abi_cxx11_
                (&local_70,(Human *)((long)&(pPVar4->super_Human).Id._M_dataplus._M_p + lVar6));
      if ((local_70._M_string_length == username->_M_string_length) &&
         ((local_70._M_string_length == 0 ||
          (iVar2 = bcmp(local_70._M_dataplus._M_p,(username->_M_dataplus)._M_p,
                        local_70._M_string_length), iVar2 == 0)))) {
        Human::Password_Getter_abi_cxx11_
                  (&local_50,
                   (Human *)((long)&(((All_Of_Patients->
                                      super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl
                                      .super__Vector_impl_data._M_start)->super_Human).Id.
                                    _M_dataplus + lVar6));
        _Var1._M_p = local_50._M_dataplus._M_p;
        if (local_50._M_string_length == password->_M_string_length) {
          if (local_50._M_string_length == 0) {
            bVar7 = true;
          }
          else {
            iVar2 = bcmp(local_50._M_dataplus._M_p,(password->_M_dataplus)._M_p,
                         local_50._M_string_length);
            bVar7 = iVar2 == 0;
          }
        }
        else {
          bVar7 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var1._M_p != &local_50.field_2) {
          operator_delete(_Var1._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar7 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pPVar4 = (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (bVar7) goto LAB_0011fa67;
      uVar5 = uVar5 + 1;
      uVar3 = ((long)(All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 4) *
              -0x30c30c30c30c30c3;
      lVar6 = lVar6 + 0x150;
    } while (uVar5 <= uVar3 && uVar3 - uVar5 != 0);
  }
  uVar5 = 0;
LAB_0011fa67:
  return pPVar4 + uVar5;
}

Assistant:

Patient* Hospital :: Entered_Patient(string username , string password , vector<Patient>All_Of_Patients){
    int g =0;
    for (int i = 0; i < All_Of_Patients.size(); ++i) {
        if (All_Of_Patients[i].User_name_Getter() == username && All_Of_Patients[i].Password_Getter() == password) {
            g = i;
            break;
        }
    }

    return &All_Of_Patients[g];
}